

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O0

duckdb_state
duckdb_bind_varchar_length
          (duckdb_prepared_statement prepared_statement,idx_t param_idx,char *val,idx_t length)

{
  duckdb_state dVar1;
  ulong in_RCX;
  char *in_RDX;
  Value value;
  duckdb_value in_stack_000000f8;
  idx_t in_stack_00000100;
  duckdb_prepared_statement in_stack_00000108;
  undefined4 in_stack_ffffffffffffff40;
  allocator local_89;
  string local_88 [64];
  string *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,in_RDX,in_RCX,&local_89);
  duckdb::Value::Value(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  dVar1 = duckdb_bind_value(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  duckdb::Value::~Value((Value *)CONCAT44(dVar1,in_stack_ffffffffffffff40));
  return dVar1;
}

Assistant:

duckdb_state duckdb_bind_varchar_length(duckdb_prepared_statement prepared_statement, idx_t param_idx, const char *val,
                                        idx_t length) {
	try {
		auto value = Value(std::string(val, length));
		return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&value);
	} catch (...) {
		return DuckDBError;
	}
}